

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswTable.c
# Opt level: O1

uint Csw_CutHash(Csw_Cut_t *pCut)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  
  cVar1 = pCut->nFanins;
  if (0x10 < (long)cVar1) {
    __assert_fail("pCut->nFanins <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswTable.c"
                  ,0x40,"unsigned int Csw_CutHash(Csw_Cut_t *)");
  }
  if ('\0' < cVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 ^ *(int *)((long)Csw_CutHash::s_FPrimes + lVar3) *
                      *(int *)((long)&pCut[1].pNext + lVar3);
      lVar3 = lVar3 + 4;
    } while ((long)cVar1 * 4 != lVar3);
    return uVar2;
  }
  return 0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes hash value of the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
unsigned Csw_CutHash( Csw_Cut_t * pCut )
{
    static int s_FPrimes[128] = { 
        1009, 1049, 1093, 1151, 1201, 1249, 1297, 1361, 1427, 1459, 
        1499, 1559, 1607, 1657, 1709, 1759, 1823, 1877, 1933, 1997, 
        2039, 2089, 2141, 2213, 2269, 2311, 2371, 2411, 2467, 2543, 
        2609, 2663, 2699, 2741, 2797, 2851, 2909, 2969, 3037, 3089, 
        3169, 3221, 3299, 3331, 3389, 3461, 3517, 3557, 3613, 3671, 
        3719, 3779, 3847, 3907, 3943, 4013, 4073, 4129, 4201, 4243, 
        4289, 4363, 4441, 4493, 4549, 4621, 4663, 4729, 4793, 4871, 
        4933, 4973, 5021, 5087, 5153, 5227, 5281, 5351, 5417, 5471, 
        5519, 5573, 5651, 5693, 5749, 5821, 5861, 5923, 6011, 6073, 
        6131, 6199, 6257, 6301, 6353, 6397, 6481, 6563, 6619, 6689, 
        6737, 6803, 6863, 6917, 6977, 7027, 7109, 7187, 7237, 7309, 
        7393, 7477, 7523, 7561, 7607, 7681, 7727, 7817, 7877, 7933, 
        8011, 8039, 8059, 8081, 8093, 8111, 8123, 8147
    };
    unsigned uHash;
    int i;
    assert( pCut->nFanins <= 16 );
    uHash = 0;
    for ( i = 0; i < pCut->nFanins; i++ )
        uHash ^= pCut->pFanins[i] * s_FPrimes[i];
    return uHash;
}